

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildObjectAPIConstructorBodyVectors
          (SwiftGenerator *this,FieldDef *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *base_constructor,string *indentation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  mapped_type *pmVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  long *plVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string field_var;
  Type vectortype;
  string field_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Type local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0.base_type = (field->value).type.element;
  local_d0.struct_def._0_4_ = *(undefined4 *)&(field->value).type.struct_def;
  local_d0.struct_def._4_4_ = *(undefined4 *)((long)&(field->value).type.struct_def + 4);
  local_d0.enum_def._0_4_ = *(undefined4 *)&(field->value).type.enum_def;
  local_d0.enum_def._4_4_ = *(undefined4 *)((long)&(field->value).type.enum_def + 4);
  local_d0.fixed_length = (field->value).type.fixed_length;
  local_d0.element = BASE_TYPE_NONE;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_f0,&this->namer_,field);
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_b0,&this->namer_,field);
  if (local_d0.base_type != BASE_TYPE_UTYPE) {
    paVar1 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    std::__cxx11::string::append((char *)&local_170);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               buffer_constructor,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_150,"for index in 0..<_t.",&local_b0);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_170.field_2._M_allocated_capacity = *psVar7;
      local_170.field_2._8_8_ = plVar4[3];
      local_170._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar7;
      local_170._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_170._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               buffer_constructor,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    std::__cxx11::string::append((char *)&local_170);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)base_constructor
               ,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  switch(local_d0.base_type) {
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    goto switchD_002fc644_caseD_e;
  case BASE_TYPE_STRUCT:
    paVar1 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"VALUETYPE","");
    GenType_abi_cxx11_(&local_150,this,&local_d0,true);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->code_).value_map_,&local_170);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    paVar2 = &local_150.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}?]","");
    CodeWriter::operator+=(&this->code_,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_150._M_dataplus._M_p = (pointer)paVar2;
    if (*(char *)(CONCAT44(local_d0.struct_def._4_4_,local_d0.struct_def._0_4_) + 0x110) == '\0') {
      pcVar3 = (indentation->_M_dataplus)._M_p;
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar3,pcVar3 + indentation->_M_string_length);
      std::__cxx11::string::append((char *)&local_130);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_130,(ulong)local_b0._M_dataplus._M_p);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_150.field_2._M_allocated_capacity = *psVar7;
        local_150.field_2._8_8_ = plVar4[3];
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar7;
        local_150._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_150._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170.field_2._8_8_ = plVar4[3];
        local_170._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_170._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar1) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      std::operator+(&local_150,indentation,&local_f0);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170.field_2._8_8_ = puVar6[3];
        local_170._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_170._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar1) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      uVar9 = local_150.field_2._M_allocated_capacity;
      _Var10._M_p = local_150._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == paVar2) goto switchD_002fc644_caseD_e;
    }
    else {
      std::operator+(&local_110,indentation,&local_f0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_130 = &local_120;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_120 = *plVar8;
        lStack_118 = plVar4[3];
      }
      else {
        local_120 = *plVar8;
        local_130 = (long *)*plVar4;
      }
      local_128 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0._M_dataplus._M_p);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_150.field_2._M_allocated_capacity = *psVar7;
        local_150.field_2._8_8_ = puVar6[3];
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar7;
        local_150._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_150._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170.field_2._8_8_ = puVar6[3];
        local_170._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_170._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar1) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) {
LAB_002fccd4:
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
LAB_002fcce1:
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      uVar9 = local_110.field_2._M_allocated_capacity;
      _Var10._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == &local_110.field_2) goto switchD_002fc644_caseD_e;
    }
    break;
  case BASE_TYPE_UNION:
    BuildUnionEnumSwitchCase
              (this,(field->value).type.enum_def,&local_f0,buffer_constructor,indentation,true);
    goto switchD_002fc644_caseD_e;
  default:
    if (local_d0.base_type == BASE_TYPE_UTYPE) goto switchD_002fc644_caseD_e;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"VALUETYPE","");
    if (local_d0.base_type == BASE_TYPE_STRING) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"String?","");
    }
    else {
      GenType_abi_cxx11_(&local_150,this,&local_d0,false);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->code_).value_map_,&local_170);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}]","");
    CodeWriter::operator+=(&this->code_,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_170.field_2;
    paVar2 = &local_150.field_2;
    if ((CONCAT44(local_d0.enum_def._4_4_,local_d0.enum_def._0_4_) == 0) ||
       (9 < local_d0.base_type - BASE_TYPE_UTYPE)) {
      std::operator+(&local_110,indentation,&local_f0);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      local_130 = &local_120;
      plVar4 = puVar6 + 2;
      if ((long *)*puVar6 == plVar4) {
        local_120 = *plVar4;
        lStack_118 = puVar6[3];
      }
      else {
        local_120 = *plVar4;
        local_130 = (long *)*puVar6;
      }
      local_128 = puVar6[1];
      *puVar6 = plVar4;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_130,(ulong)local_b0._M_dataplus._M_p);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_150.field_2._M_allocated_capacity = *psVar7;
        local_150.field_2._8_8_ = plVar4[3];
        local_150._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar7;
        local_150._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_150._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170.field_2._8_8_ = puVar6[3];
        local_170._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar7;
        local_170._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_170._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar1) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) goto LAB_002fccd4;
      goto LAB_002fcce1;
    }
    if (((field->value).type.enum_def == (EnumDef *)0x0) ||
       (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
      SwiftConstant_abi_cxx11_(&local_170,this,field);
    }
    else {
      GenEnumDefaultValue_abi_cxx11_(&local_170,this,field);
    }
    std::operator+(&local_50,indentation,&local_f0);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_110.field_2._M_allocated_capacity = *psVar7;
      local_110.field_2._8_8_ = plVar4[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar7;
      local_110._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_110._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
    plVar4 = puVar6 + 2;
    if ((long *)*puVar6 == plVar4) {
      local_120 = *plVar4;
      lStack_118 = puVar6[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar4;
      local_130 = (long *)*puVar6;
    }
    local_128 = puVar6[1];
    *puVar6 = plVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
    psVar7 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150.field_2._8_8_ = puVar6[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_150._M_string_length = puVar6[1];
    *puVar6 = psVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               buffer_constructor,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar9 = local_170.field_2._M_allocated_capacity;
    _Var10._M_p = local_170._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == paVar1) goto switchD_002fc644_caseD_e;
  }
  operator_delete(_Var10._M_p,uVar9 + 1);
switchD_002fc644_caseD_e:
  if (local_d0.base_type != BASE_TYPE_UTYPE) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"}","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               buffer_constructor,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuildObjectAPIConstructorBodyVectors(
      const FieldDef &field, std::vector<std::string> &buffer_constructor,
      std::vector<std::string> &base_constructor,
      const std::string &indentation) {
    const auto vectortype = field.value.type.VectorType();
    const auto field_var = namer_.Field(field);
    const auto field_field = namer_.Field(field);

    if (vectortype.base_type != BASE_TYPE_UTYPE) {
      buffer_constructor.push_back(field_var + " = []");
      buffer_constructor.push_back("for index in 0..<_t." + field_field +
                                   "Count {");
      base_constructor.push_back(field_var + " = []");
    }

    switch (vectortype.base_type) {
      case BASE_TYPE_STRUCT: {
        code_.SetValue("VALUETYPE", GenType(vectortype, true));
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}?]";
        if (!vectortype.struct_def->fixed) {
          buffer_constructor.push_back(indentation + "var __v_ = _t." +
                                       field_field + "(at: index)");
          buffer_constructor.push_back(indentation + field_var +
                                       ".append(__v_?.unpack())");
        } else {
          buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                       field_var + "(at: index))");
        }
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
      case BASE_TYPE_VECTOR: {
        break;
      }
      case BASE_TYPE_UNION: {
        BuildUnionEnumSwitchCase(*field.value.type.enum_def, field_var,
                                 buffer_constructor, indentation, true);
        break;
      }
      case BASE_TYPE_UTYPE: break;
      default: {
        code_.SetValue(
            "VALUETYPE",
            (IsString(vectortype) ? "String?" : GenType(vectortype)));
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}]";

        if (IsEnum(vectortype) && vectortype.base_type != BASE_TYPE_UNION) {
          const auto default_value = IsEnum(field.value.type)
                                         ? GenEnumDefaultValue(field)
                                         : SwiftConstant(field);
          buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                       field_field + "(at: index)!)");
          break;
        }
        buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                     field_field + "(at: index))");
        break;
      }
    }
    if (vectortype.base_type != BASE_TYPE_UTYPE)
      buffer_constructor.push_back("}");
  }